

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O2

void __thiscall HVectorBase<HighsCDouble>::pack(HVectorBase<HighsCDouble> *this)

{
  pointer pHVar1;
  pointer pHVar2;
  int iVar3;
  double dVar4;
  HighsInt i;
  long lVar5;
  int iVar6;
  
  if (this->packFlag == true) {
    this->packFlag = false;
    this->packCount = 0;
    iVar6 = 0;
    for (lVar5 = 0; lVar5 < this->count; lVar5 = lVar5 + 1) {
      iVar3 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar5];
      (this->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[iVar6] = iVar3;
      pHVar1 = (this->array).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
               .super__Vector_impl_data._M_start + iVar3;
      dVar4 = pHVar1->lo;
      pHVar2 = (this->packValue).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start + this->packCount;
      pHVar2->hi = pHVar1->hi;
      pHVar2->lo = dVar4;
      iVar6 = this->packCount + 1;
      this->packCount = iVar6;
    }
  }
  return;
}

Assistant:

void HVectorBase<Real>::pack() {
  /*
   * Packing (if packFlag set): Pack values/indices in Vector.array
   * into packValue/Index
   */
  if (!packFlag) return;
  packFlag = false;
  packCount = 0;
  for (HighsInt i = 0; i < count; i++) {
    const HighsInt ipack = index[i];
    packIndex[packCount] = ipack;
    packValue[packCount] = array[ipack];
    packCount++;
  }
}